

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxFunctionCall::FxFunctionCall
          (FxFunctionCall *this,FName *methodname,FName *rngname,FArgumentList *args,
          FScriptPosition *pos)

{
  bool bVar1;
  int iVar2;
  FRandom *pFVar3;
  char *pcVar4;
  FScriptPosition *pos_local;
  FArgumentList *args_local;
  FName *rngname_local;
  FName *methodname_local;
  FxFunctionCall *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_FunctionCall,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxFunctionCall_00a0b078;
  FName::FName(&this->MethodName);
  TDeletingArray<FxExpression_*,_FxExpression_*>::TDeletingArray(&this->ArgList);
  FName::operator=(&this->MethodName,methodname);
  this->RNG = &pr_exrandom;
  TDeletingArray<FxExpression_*,_FxExpression_*>::operator=(&this->ArgList,args);
  bVar1 = FName::operator!=(rngname,NAME_None);
  if (bVar1) {
    iVar2 = FName::operator_cast_to_int(&this->MethodName);
    if (iVar2 - 0xd1U < 5) {
      pcVar4 = FName::GetChars(rngname);
      pFVar3 = FRandom::StaticFindRNG(pcVar4);
      this->RNG = pFVar3;
    }
    else {
      pcVar4 = FName::GetChars(&this->MethodName);
      FScriptPosition::Message(pos,2,"Cannot use named RNGs with %s",pcVar4);
    }
  }
  return;
}

Assistant:

FxFunctionCall::FxFunctionCall(FName methodname, FName rngname, FArgumentList &args, const FScriptPosition &pos)
: FxExpression(EFX_FunctionCall, pos)
{
	MethodName = methodname;
	RNG = &pr_exrandom;
	ArgList = std::move(args);
	if (rngname != NAME_None)
	{
		switch (MethodName)
		{
		case NAME_Random:
		case NAME_FRandom:
		case NAME_RandomPick:
		case NAME_FRandomPick:
		case NAME_Random2:
			RNG = FRandom::StaticFindRNG(rngname.GetChars());
			break;

		default:
			pos.Message(MSG_ERROR, "Cannot use named RNGs with %s", MethodName.GetChars());
			break;

		}
	}
}